

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O3

void __thiscall puppup::Game::checkWinner(Game *this)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar3 = this->turn_;
  lVar5 = (this->state_).score;
  lVar6 = 0;
  uVar4 = uVar3 ^ 1;
  do {
    plVar1 = (long *)((long)(this->racks_)._M_elems[uVar4]._M_elems + lVar6);
    plVar2 = (long *)((long)&scores + lVar6);
    lVar6 = lVar6 + 8;
    lVar5 = lVar5 + *plVar1 * *plVar2;
    (this->state_).score = lVar5;
  } while (lVar6 != 0xd8);
  if (0 < lVar5) {
    this->winner_ = uVar3;
    return;
  }
  if (-1 < lVar5) {
    this->winner_ = 2;
    return;
  }
  this->winner_ = uVar4;
  return;
}

Assistant:

void checkWinner() {
        for (chr i = 0; i < 27; ++i) {
            state_.score += scores[i] * racks_[turn_ ^ 1][i];
        }
        // print(racks_[turn_]);
        // print(racks_[turn_ ^ 1]);
        // std::cerr << state_.score << std::endl;
        if (state_.score > 0) {
            winner_ = turn_;
        } else if (state_.score < 0) {
            winner_ = turn_ ^ 1;
        } else {
            winner_ = 2;
        }
    }